

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

bool __thiscall
bloaty::RangeSink::IsVerboseForVMRange(RangeSink *this,uint64_t vmaddr,uint64_t vmsize)

{
  _Base_ptr p_Var1;
  _Base_ptr *buffer;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  const_iterator iter;
  Nonnull<char_*> pcVar5;
  Arg *in_R9;
  bool bVar6;
  string_view format;
  RangeMap file_map;
  RangeMap vm_map;
  string local_b0;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  size_t local_68;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  if (vmsize == 0xffffffffffffffff) {
    vmsize = ~vmaddr;
  }
  if (vmsize <= ~vmaddr) {
    bVar6 = true;
    if (((this->options_).verbose_level_ < 2) &&
       ((((this->options_)._has_bits_.has_bits_[0] & 0x40) == 0 ||
        (uVar2 = (this->options_).debug_vmaddr_, uVar2 < vmaddr || vmsize + vmaddr <= uVar2)))) {
      if (this->translator_ == (DualMap *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = false;
        if (((this->options_)._has_bits_.has_bits_[0] & 0x80) != 0) {
          local_58._M_left = &local_58;
          local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
          local_58._M_parent = (_Base_ptr)0x0;
          local_38 = 0;
          p_Var1 = (_Base_ptr)(local_90 + 8);
          local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
          local_80 = (_Base_ptr)0x0;
          local_68 = 0;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_78 = p_Var1;
          local_70 = p_Var1;
          local_58._M_right = local_58._M_left;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,anon_var_dwarf_3d3289 + 0x11);
          RangeMap::AddRangeWithTranslation
                    ((RangeMap *)local_60,vmaddr,vmsize,&local_b0,&this->translator_->vm_map,false,
                     (RangeMap *)local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          bVar6 = false;
          if (local_78 != p_Var1) {
            iter._M_node = local_78;
            bVar6 = false;
            do {
              uVar2 = *(ulong *)(iter._M_node + 1);
              uVar4 = RangeMap::RangeEndUnknownLimit((RangeMap *)local_90,iter,0xffffffffffffffff);
              if ((1 < (this->options_).verbose_level_) ||
                 (((((this->options_)._has_bits_.has_bits_[0] & 0x80) != 0 &&
                   (uVar3 = (this->options_).debug_fileoff_, uVar2 <= uVar3)) &&
                  (uVar3 < (uVar4 + uVar2) - *(long *)(iter._M_node + 1))))) {
                bVar6 = true;
              }
              iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
            } while (iter._M_node != p_Var1);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                       *)local_90);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                       *)local_60);
        }
      }
    }
    return bVar6;
  }
  buffer = &local_58._M_parent;
  pcVar5 = absl::numbers_internal::FastIntToBuffer(vmaddr,(Nonnull<char_*>)buffer);
  local_60 = (undefined1  [8])((long)pcVar5 - (long)buffer);
  local_58._0_8_ = buffer;
  pcVar5 = absl::numbers_internal::FastIntToBuffer(vmsize,(Nonnull<char_*>)&local_80);
  local_90._0_8_ = (long)pcVar5 - (long)&local_80;
  format._M_str = local_60;
  format._M_len = (size_t)"Overflow in vm range, vmaddr=$0, vmsize=$1";
  local_90._8_8_ = &local_80;
  absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x2a,format,(Arg *)local_90,in_R9);
  Throw(local_b0._M_dataplus._M_p,0x459);
}

Assistant:

bool RangeSink::IsVerboseForVMRange(uint64_t vmaddr, uint64_t vmsize) {
  if (vmsize == RangeMap::kUnknownSize) {
    vmsize = UINT64_MAX - vmaddr;
  }

  if (vmaddr + vmsize < vmaddr) {
    THROWF("Overflow in vm range, vmaddr=$0, vmsize=$1", vmaddr, vmsize);
  }

  if (ContainsVerboseVMAddr(vmaddr, vmsize)) {
    return true;
  }

  if (translator_ && options_.has_debug_fileoff()) {
    RangeMap vm_map;
    RangeMap file_map;
    bool contains = false;
    vm_map.AddRangeWithTranslation(vmaddr, vmsize, "", translator_->vm_map,
                                   false, &file_map);
    file_map.ForEachRange(
        [this, &contains](uint64_t fileoff, uint64_t filesize) {
          if (ContainsVerboseFileOffset(fileoff, filesize)) {
            contains = true;
          }
        });
    return contains;
  }

  return false;
}